

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O0

void __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>,-1,1,false>,-1,1,true>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>const,-1,1,false>const>const>>
::
copyPacket<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>const,_1,1,false>const>const>,1,0>
          (SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,_1,_false>_>_>_>
           *this,Index index,
          DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,_1,_false>_>_>_>
          *other)

{
  EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,_1,_false>_>_>_>
  *in_RDX;
  MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false>,__1,_1,_true>,_0>
  *in_RSI;
  double (*in_RDI) [2];
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,_1,_false>_>_>
  *_other;
  scalar_difference_op<double> *this_00;
  double index_00;
  Index in_stack_ffffffffffffffa8;
  CwiseUnaryOpImpl<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,_1,_false>_>,_Eigen::Dense>
  *in_stack_ffffffffffffffb0;
  
  EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_1,_false>_>_>_>
  ::const_cast_derived(in_RDX);
  index_00 = (*in_RDI)[0];
  this_00 = (scalar_difference_op<double> *)(*in_RDI)[1];
  MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>,_-1,_1,_false>,_-1,_1,_true>,_0>
  ::packet<1>(in_RSI,(Index)index_00);
  CwiseUnaryOpImpl<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_1,_false>_>,_Eigen::Dense>
  ::packet<0>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  internal::scalar_difference_op<double>::packetOp<double__vector(2)>
            (this_00,in_RDI,(double (*) [2])0x2b5559);
  MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>,_-1,_1,_false>,_-1,_1,_true>,_1>
  ::writePacket<1>((MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,__1,_1,_false>,__1,_1,_true>,_1>
                    *)in_RSI,(Index)index_00,(PacketScalar *)this_00);
  return;
}

Assistant:

void copyPacket(Index index, const DenseBase<OtherDerived>& other)
    {
      OtherDerived& _other = other.const_cast_derived();
      eigen_internal_assert(index >= 0 && index < m_matrix.size());
      m_matrix.template writePacket<StoreMode>(index,
        m_functor.packetOp(m_matrix.template packet<StoreMode>(index),_other.template packet<LoadMode>(index)) );
    }